

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator&(sc_signed *__return_storage_ptr__,long u,sc_signed *v)

{
  int vs;
  bool bVar1;
  ulong uVar2;
  sc_length_param *psVar3;
  ulong uVar4;
  size_t __n;
  small_type us;
  sc_digit ud [3];
  
  if ((u == 0) || (vs = v->sgn, vs == 0)) {
    psVar3 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar3->m_len);
  }
  else {
    us = 1;
    if ((u < 1) && (us = 0, u != 0)) {
      us = -1;
      u = -u;
    }
    __n = 0xc;
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      ud[uVar4] = (uint)u & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar4) break;
      bVar1 = 0x3fffffff < (ulong)u;
      u = (ulong)u >> 0x1e;
      uVar2 = uVar4 + 1;
    } while (bVar1);
    if (uVar4 < 2) {
      memset(ud + uVar4 + 1,0,__n);
    }
    and_signed_friend(__return_storage_ptr__,us,0x40,3,ud,vs,v->nbits,v->ndigits,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator&(long u, const sc_signed& v)
{

  if ((u == 0) || (v.sgn == SC_ZERO)) // case 1
    return sc_signed();

  CONVERT_LONG(u);

  // other cases
  return and_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}